

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkFree(Wln_Ntk_t *p)

{
  Wln_Vec_t *__ptr;
  void *__ptr_00;
  Hash_IntMan_t *__ptr_01;
  int *piVar1;
  char *__ptr_02;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 8;
  for (lVar3 = 0; __ptr = p->vFanins, lVar3 < (p->vTypes).nSize; lVar3 = lVar3 + 1) {
    if ((2 < *(int *)((long)__ptr + lVar2 + -4)) &&
       (__ptr_00 = *(void **)((long)&__ptr->nCap + lVar2), __ptr_00 != (void *)0x0)) {
      free(__ptr_00);
      *(undefined8 *)((long)&p->vFanins->nCap + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x10;
  }
  if (__ptr != (Wln_Vec_t *)0x0) {
    free(__ptr);
    p->vFanins = (Wln_Vec_t *)0x0;
  }
  __ptr_01 = p->pRanges;
  if (__ptr_01 != (Hash_IntMan_t *)0x0) {
    Vec_IntFree(__ptr_01->vObjs);
    Vec_IntFree(__ptr_01->vTable);
    free(__ptr_01);
  }
  if (p->pManName != (Abc_Nam_t *)0x0) {
    Abc_NamStop(p->pManName);
  }
  piVar1 = (p->vCis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCis).pArray = (int *)0x0;
  }
  piVar1 = (p->vCos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCos).pArray = (int *)0x0;
  }
  piVar1 = (p->vFfs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFfs).pArray = (int *)0x0;
  }
  piVar1 = (p->vTypes).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTypes).pArray = (int *)0x0;
  }
  __ptr_02 = (p->vSigns).pArray;
  if (__ptr_02 != (char *)0x0) {
    free(__ptr_02);
    (p->vSigns).pArray = (char *)0x0;
  }
  piVar1 = (p->vRanges).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vRanges).pArray = (int *)0x0;
  }
  piVar1 = (p->vNameIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vNameIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vInstIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vInstIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vTravIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  piVar1 = (p->vBits).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vBits).pArray = (int *)0x0;
  }
  piVar1 = (p->vLevels).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar1 = (p->vRefs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vRefs).pArray = (int *)0x0;
  }
  piVar1 = (p->vFanout).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFanout).pArray = (int *)0x0;
  }
  piVar1 = (p->vFaninAttrs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFaninAttrs).pArray = (int *)0x0;
  }
  piVar1 = (p->vFaninLists).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFaninLists).pArray = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  free(p->pSpec);
  free(p);
  return;
}

Assistant:

void Wln_NtkFree( Wln_Ntk_t * p )
{
    int i;
    for ( i = 0; i < Wln_NtkObjNum(p); i++ )
        if ( Wln_ObjFaninNum(p, i) > 2 ) 
            ABC_FREE( p->vFanins[i].pArray[0] );
    ABC_FREE( p->vFanins );

    if ( p->pRanges )  Hash_IntManStop( p->pRanges );
    if ( p->pManName ) Abc_NamStop( p->pManName );

    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->vFfs.pArray );

    ABC_FREE( p->vTypes.pArray );
    ABC_FREE( p->vSigns.pArray );
    ABC_FREE( p->vRanges.pArray );
    ABC_FREE( p->vNameIds.pArray );
    ABC_FREE( p->vInstIds.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vBits.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vFanout.pArray );
    ABC_FREE( p->vFaninAttrs.pArray );
    ABC_FREE( p->vFaninLists.pArray );

    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}